

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# damageind.cpp
# Opt level: O0

void __thiscall CDamageInd::OnRender(CDamageInd *this)

{
  float *pfVar1;
  long lVar2;
  vector2_base<float> b;
  int iVar3;
  IGraphics *pIVar4;
  IClient *this_00;
  vector2_base<float> in_RDI;
  long in_FS_OFFSET;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar5;
  float v;
  float fVar6;
  float fVar7;
  float Alpha;
  vec2 Pos;
  int i;
  float Now;
  CGameClient *in_stack_ffffffffffffff98;
  CItem *pCVar8;
  int in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar9;
  vector2_base<float> a;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  a = in_RDI;
  pIVar4 = CComponent::Graphics((CComponent *)0x15e18a);
  (*(pIVar4->super_IInterface)._vptr_IInterface[0x13])
            (pIVar4,(ulong)(uint)g_pData->m_aImages[1].m_Id.m_Id);
  pIVar4 = CComponent::Graphics((CComponent *)0x15e1b9);
  (*(pIVar4->super_IInterface)._vptr_IInterface[0x17])();
  this_00 = CComponent::Client((CComponent *)0x15e1cf);
  aVar5.y = IClient::LocalTime(this_00);
  if ((OnRender()::s_LastLocalTime == '\0') &&
     (iVar3 = __cxa_guard_acquire(&OnRender()::s_LastLocalTime), iVar3 != 0)) {
    OnRender::s_LastLocalTime = aVar5.y;
    __cxa_guard_release(&OnRender()::s_LastLocalTime);
  }
  aVar9.x = 0.0;
  while ((int)aVar9 < *(int *)((long)in_RDI + 0x610)) {
    v = aVar5.y - OnRender::s_LastLocalTime;
    fVar6 = CGameClient::GetAnimationPlaybackSpeed(in_stack_ffffffffffffff98);
    ((CItem *)((long)in_RDI + 0x10))[(int)aVar9].m_LifeTime =
         -v * fVar6 + ((CItem *)((long)in_RDI + 0x10))[(int)aVar9].m_LifeTime;
    pfVar1 = (float *)((long)in_RDI + (long)(int)aVar9 * 0x18 + 0x20);
    if (0.0 < *pfVar1 || *pfVar1 == 0.0) {
      pCVar8 = (CItem *)((long)in_RDI + 0x10) + (int)aVar9;
      vector2_base<float>::operator*((vector2_base<float> *)in_RDI,v);
      vector2_base<float>::operator+
                ((vector2_base<float> *)in_RDI,
                 (vector2_base<float> *)CONCAT44(v,in_stack_ffffffffffffffa8));
      clamp<float>((((float *)((long)in_RDI + 0x20))[(long)(int)aVar9 * 6] + -0.6) / 0.15,0.0,1.0);
      b.field_1.y = aVar5.y;
      b.field_0 = aVar9;
      mix<vector2_base<float>,float>(a,b,in_RDI.field_1.y);
      fVar7 = clamp<float>(*(float *)((long)in_RDI + (long)(int)aVar9 * 0x18 + 0x20) * 10.0,0.0,1.0)
      ;
      pIVar4 = CComponent::Graphics((CComponent *)0x15e3bc);
      (*(pIVar4->super_IInterface)._vptr_IInterface[0x21])
                ((ulong)(uint)(fVar7 * 1.0),(ulong)(uint)(fVar7 * 1.0),fVar7 * 1.0,fVar7);
      pIVar4 = CComponent::Graphics((CComponent *)0x15e402);
      fVar6 = *(float *)((long)in_RDI + (long)(int)aVar9 * 0x18 + 0x20);
      (*(pIVar4->super_IInterface)._vptr_IInterface[0x19])
                ((ulong)(uint)(fVar6 + fVar6 +
                              *(float *)((long)in_RDI + (long)(int)aVar9 * 0x18 + 0x24)));
      CComponent::RenderTools((CComponent *)0x15e452);
      CRenderTools::SelectSprite
                ((CRenderTools *)in_RDI,(int)v,in_stack_ffffffffffffffa8,
                 (int)((ulong)pCVar8 >> 0x20),(int)pCVar8);
      CComponent::RenderTools((CComponent *)0x15e472);
      CRenderTools::DrawSprite
                ((CRenderTools *)CONCAT44(fVar7,in_stack_ffffffffffffffb8),in_RDI.field_1.y,
                 in_RDI.field_0.x,v);
      aVar9.x = aVar9.x + 1;
    }
    else {
      DestroyItem((CDamageInd *)in_RDI,(CItem *)((long)in_RDI + 0x10) + (int)aVar9);
    }
  }
  pIVar4 = CComponent::Graphics((CComponent *)0x15e4a8);
  (*(pIVar4->super_IInterface)._vptr_IInterface[0x18])();
  OnRender::s_LastLocalTime = aVar5.y;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CDamageInd::OnRender()
{
	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_GAME].m_Id);
	Graphics()->QuadsBegin();
	const float Now = Client()->LocalTime();
	static float s_LastLocalTime = Now;
	for(int i = 0; i < m_NumItems;)
	{
		m_aItems[i].m_LifeTime -= (Now - s_LastLocalTime) * m_pClient->GetAnimationPlaybackSpeed();
		if(m_aItems[i].m_LifeTime < 0.0f)
			DestroyItem(&m_aItems[i]);
		else
		{
			vec2 Pos = mix(m_aItems[i].m_Pos+m_aItems[i].m_Dir*75.0f, m_aItems[i].m_Pos, clamp((m_aItems[i].m_LifeTime-0.60f)/0.15f, 0.0f, 1.0f));
			const float Alpha = clamp(m_aItems[i].m_LifeTime * 10.0f, 0.0f, 1.0f); // 0.1 -> 0.0 == 1.0 -> 0.0
			Graphics()->SetColor(1.0f*Alpha, 1.0f*Alpha, 1.0f*Alpha, Alpha);
			Graphics()->QuadsSetRotation(m_aItems[i].m_StartAngle + m_aItems[i].m_LifeTime * 2.0f);
			RenderTools()->SelectSprite(SPRITE_STAR1);
			RenderTools()->DrawSprite(Pos.x, Pos.y, 48.0f);
			i++;
		}
	}
	Graphics()->QuadsEnd();
	s_LastLocalTime = Now;
}